

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSweptDiskSolid::IfcSweptDiskSolid(IfcSweptDiskSolid *this)

{
  IfcSweptDiskSolid *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x70,"IfcSweptDiskSolid");
  IfcSolidModel::IfcSolidModel(&this->super_IfcSolidModel,&PTR_construction_vtable_24__00e30778);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSweptDiskSolid,_5UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSweptDiskSolid,_5UL> *)
             &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.field_0x30,
             &PTR_construction_vtable_24__00e307f0);
  (this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xe306c0;
  *(undefined8 *)&this->field_0x70 = 0xe30760;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xe306e8;
  *(undefined8 *)
   &(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xe30710;
  *(undefined8 *)&(this->super_IfcSolidModel).super_IfcGeometricRepresentationItem.field_0x30 =
       0xe30738;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCurve>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcCurve> *)&(this->super_IfcSolidModel).field_0x40,
             (LazyObject *)0x0);
  STEP::Maybe<double>::Maybe(&this->InnerRadius);
  return;
}

Assistant:

IfcSweptDiskSolid() : Object("IfcSweptDiskSolid") {}